

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

ostream * wavingz::zwave_print<unsigned_char*>(ostream *out,uchar *data_begin,uchar *data_end)

{
  _Setfill<char> _Var1;
  value_type_conflict vVar2;
  _Setw _Var3;
  undefined8 uVar4;
  ostream *poVar5;
  void *pvVar6;
  int local_58;
  int i;
  packet_t *p;
  size_t len;
  byte *local_30;
  uchar *ch;
  uchar *data_end_local;
  uchar *data_begin_local;
  ostream *out_local;
  
  for (local_30 = data_begin; local_30 != data_end; local_30 = local_30 + 1) {
    uVar4 = std::ostream::operator<<(out,std::hex);
    _Var1 = std::setfill<char>('0');
    poVar5 = std::operator<<(uVar4,_Var1._M_c);
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)*local_30);
    std::operator<<(poVar5,' ');
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  if ((((data_begin == (uchar *)0x0) || (data_begin[7] == '\0')) ||
      ((ulong)((long)data_end - (long)data_begin) < 10)) ||
     ((ulong)((long)data_end - (long)data_begin) < (ulong)data_begin[7])) {
    std::operator<<(out,"[ ] ");
  }
  else {
    vVar2 = checksum<unsigned_char*>(data_begin,data_begin + ((ulong)data_begin[7] - 1));
    if (vVar2 == data_begin[(int)(data_begin[7] - 1)]) {
      std::operator<<(out,"[x] ");
    }
    else {
      std::operator<<(out,"[ ] ");
    }
    uVar4 = std::ostream::operator<<(out,std::hex);
    _Var1 = std::setfill<char>('0');
    poVar5 = std::operator<<(uVar4,_Var1._M_c);
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = std::operator<<(poVar5,"HomeId: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,CONCAT13(*data_begin,
                                        CONCAT12(data_begin[1],CONCAT11(data_begin[2],data_begin[3])
                                                )));
    poVar5 = std::operator<<(poVar5,", SourceNodeId: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,(uint)data_begin[4]);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::hex);
    poVar5 = std::operator<<(poVar5,", FC0: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)data_begin[5]);
    poVar5 = std::operator<<(poVar5,", FC1: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,(uint)data_begin[6]);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
    poVar5 = std::operator<<(poVar5,", FC[speed=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[5] >> 4 & 1));
    poVar5 = std::operator<<(poVar5," low_power=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[5] >> 5 & 1));
    poVar5 = std::operator<<(poVar5," ack_request=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[5] >> 6 & 1));
    poVar5 = std::operator<<(poVar5," header_type=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[5] & 0xf));
    poVar5 = std::operator<<(poVar5," beaming_info=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[6] >> 4));
    poVar5 = std::operator<<(poVar5," seq=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ushort)(data_begin[6] & 0xf));
    poVar5 = std::operator<<(poVar5,"], Length: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(uint)data_begin[7]);
    poVar5 = std::operator<<(poVar5,", DestNodeId: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(uint)data_begin[8]);
    poVar5 = std::operator<<(poVar5,", CommandClass: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar6,(uint)data_begin[9]);
    poVar5 = std::operator<<(poVar5,", Payload: ");
    uVar4 = std::ostream::operator<<(poVar5,std::hex);
    _Var1 = std::setfill<char>('0');
    std::operator<<(uVar4,_Var1._M_c);
    for (local_58 = 10; local_58 < (int)(data_begin[7] - 1); local_58 = local_58 + 1) {
      _Var3 = std::setw(2);
      poVar5 = std::operator<<(out,_Var3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)data_begin[local_58]);
      std::operator<<(poVar5," ");
    }
  }
  return out;
}

Assistant:

inline std::ostream&
zwave_print(std::ostream& out, It data_begin, It data_end)
{
    for(auto ch = data_begin; ch != data_end; ++ch)
        out << std::hex << std::setfill('0') << std::setw(2) << (int)*ch << ' ';
    out << std::endl;

    size_t len = data_end - data_begin;
    packet_t& p = *(packet_t*)data_begin;
    if (data_begin == 0 || p.length == 0 || len < sizeof(packet_t) || len < p.length)
    {
        out << "[ ] ";
        return out;
    }
    else if (checksum(data_begin, data_begin + (size_t)p.length - 1) !=
             data_begin[p.length - 1])
    {
        out << "[ ] ";
    }
    else
    {
        out << "[x] ";
    }
    out << std::hex << std::setfill('0') << std::setw(2)
        << "HomeId: " << ((uint32_t)p.home_id3 | p.home_id2 << 8 |
                          p.home_id1 << 16 | p.home_id0 << 24)
        << ", SourceNodeId: " << (int)p.source_node_id << std::hex
        << ", FC0: " << (int)p.fc0 << ", FC1: " << (int)p.fc1 << std::dec
        << ", FC[speed=" << p.frame_control_0.speed
        << " low_power=" << p.frame_control_0.low_power
        << " ack_request=" << p.frame_control_0.ack_request
        << " header_type=" << p.frame_control_0.header_type
        << " beaming_info=" << p.frame_control_1.beaming_info
        << " seq=" << p.frame_control_1.sequence_number
        << "], Length: " << std::dec << (int)p.length
        << ", DestNodeId: " << std::dec << (int)p.dest_node_id
        << ", CommandClass: " << std::hex << (int)p.command_class
        << ", Payload: " << std::hex << std::setfill('0');
    for (int i = sizeof(packet_t); i < p.length - 1; i++) {
        out << std::setw(2) << (int)data_begin[i] << " ";
    }
    return out;
}